

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::FoldCmBool(BackwardPass *this,Instr *instr)

{
  undefined2 uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  RegOpnd *pRVar8;
  Instr *this_00;
  Instr *pIVar9;
  RegOpnd *pRVar10;
  RegOpnd *varDst;
  Instr *instrPrev;
  Instr *cmInstr;
  RegOpnd *intOpnd;
  Instr *instr_local;
  BackwardPass *this_local;
  
  if (instr->m_opcode != Conv_Bool) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2232,"(instr->m_opcode == Js::OpCode::Conv_Bool)",
                       "instr->m_opcode == Js::OpCode::Conv_Bool");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((this->tag != DeadStorePhase) || (bVar3 = IsPrePass(this), bVar3)) ||
     (bVar3 = IsCollectionPass(this), bVar3)) {
    this_local._7_1_ = false;
  }
  else {
    BVar5 = Func::HasTry(this->func);
    if (BVar5 == 0) {
      pOVar7 = IR::Instr::GetSrc1(instr);
      pRVar8 = IR::Opnd::AsRegOpnd(pOVar7);
      bVar3 = StackSym::IsInt32(pRVar8->m_sym);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x2240,"(intOpnd->m_sym->IsInt32())","intOpnd->m_sym->IsInt32()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar3 = StackSym::IsSingleDef(pRVar8->m_sym);
      if (bVar3) {
        this_00 = StackSym::GetInstrDef(pRVar8->m_sym);
        pOVar7 = IR::Instr::GetSrc2(this_00);
        if (pOVar7 == (Opnd *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          pIVar9 = IR::Instr::GetPrevRealInstrOrLabel(instr);
          if (pIVar9 == this_00) {
            uVar1 = this_00->m_opcode;
            if (((ushort)(uVar1 - 0x3b) < 8) || ((ushort)(uVar1 - 0x1cf) < 0xe)) {
              pOVar7 = IR::Instr::GetDst(instr);
              pRVar10 = IR::Opnd::AsRegOpnd(pOVar7);
              BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                (this->currentBlock->upwardExposedUses,
                                 (pRVar8->m_sym->super_Sym).m_id);
              if ((BVar4 == '\0') &&
                 (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (this->currentBlock->upwardExposedUses,
                                     (pRVar10->m_sym->super_Sym).m_id), BVar4 != '\0')) {
                pOVar7 = IR::Instr::UnlinkDst(instr);
                pRVar8 = IR::Opnd::AsRegOpnd(pOVar7);
                IR::Instr::ReplaceDst(this_00,&pRVar8->super_Opnd);
                BasicBlock::RemoveInstr(this->currentBlock,instr);
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::FoldCmBool(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::Conv_Bool);

    if (this->tag != Js::DeadStorePhase || this->IsPrePass() || this->IsCollectionPass())
    {
        return false;
    }
    if (this->func->HasTry())
    {
        // UpwardExposedUsed info can't be relied on
        return false;
    }

    IR::RegOpnd *intOpnd = instr->GetSrc1()->AsRegOpnd();

    Assert(intOpnd->m_sym->IsInt32());

    if (!intOpnd->m_sym->IsSingleDef())
    {
        return false;
    }

    IR::Instr *cmInstr = intOpnd->m_sym->GetInstrDef();

    // Should be a Cm instr...
    if (!cmInstr->GetSrc2())
    {
        return false;
    }

    IR::Instr *instrPrev = instr->GetPrevRealInstrOrLabel();

    if (instrPrev != cmInstr)
    {
        return false;
    }

    switch (cmInstr->m_opcode)
    {
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmGe_A:
    case Js::OpCode::CmUnGe_A:
    case Js::OpCode::CmGt_A:
    case Js::OpCode::CmUnGt_A:
    case Js::OpCode::CmLt_A:
    case Js::OpCode::CmUnLt_A:
    case Js::OpCode::CmLe_A:
    case Js::OpCode::CmUnLe_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::CmEq_I4:
    case Js::OpCode::CmNeq_I4:
    case Js::OpCode::CmLt_I4:
    case Js::OpCode::CmLe_I4:
    case Js::OpCode::CmGt_I4:
    case Js::OpCode::CmGe_I4:
    case Js::OpCode::CmUnLt_I4:
    case Js::OpCode::CmUnLe_I4:
    case Js::OpCode::CmUnGt_I4:
    case Js::OpCode::CmUnGe_I4:
        break;

    default:
        return false;
    }

    IR::RegOpnd *varDst = instr->GetDst()->AsRegOpnd();

    if (this->currentBlock->upwardExposedUses->Test(intOpnd->m_sym->m_id) || !this->currentBlock->upwardExposedUses->Test(varDst->m_sym->m_id))
    {
        return false;
    }

    varDst = instr->UnlinkDst()->AsRegOpnd();

    cmInstr->ReplaceDst(varDst);

    this->currentBlock->RemoveInstr(instr);

    return true;
}